

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar1;
  Transform aTStack_78 [96];
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisForceTorqueContactSensor_001e6b58;
  pTVar1 = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)operator_new(0xc0);
  ThreeAxisForceTorqueContactSensorPrivateAttributes::
  ThreeAxisForceTorqueContactSensorPrivateAttributes(pTVar1);
  this->pimpl = pTVar1;
  std::__cxx11::string::assign((char *)pTVar1);
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=(&this->pimpl->link_H_sensor,aTStack_78);
  pTVar1 = this->pimpl;
  pTVar1->parent_link_index = -1;
  std::__cxx11::string::assign((char *)&pTVar1->parent_link_name);
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor()
{
    this->pimpl = new ThreeAxisForceTorqueContactSensorPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";

}